

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

int set_content_encoding(IOTHUB_MESSAGE_HANDLE_DATA *handleData,char *encoding)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  char *tmp_encoding;
  char *pcStack_18;
  int result;
  char *encoding_local;
  IOTHUB_MESSAGE_HANDLE_DATA *handleData_local;
  
  pcStack_18 = encoding;
  encoding_local = (char *)handleData;
  iVar1 = mallocAndStrcpy_s((char **)&l,encoding);
  if (iVar1 == 0) {
    if (*(long *)(encoding_local + 0x30) != 0) {
      free(*(void **)(encoding_local + 0x30));
    }
    *(LOGGER_LOG *)(encoding_local + 0x30) = l;
    tmp_encoding._4_4_ = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"set_content_encoding",0x80,1,"Failed saving a copy of contentEncoding");
    }
    tmp_encoding._4_4_ = 0x81;
  }
  return tmp_encoding._4_4_;
}

Assistant:

static int set_content_encoding(IOTHUB_MESSAGE_HANDLE_DATA* handleData, const char* encoding)
{
    int result;
    char* tmp_encoding;

    if (mallocAndStrcpy_s(&tmp_encoding, encoding) != 0)
    {
        LogError("Failed saving a copy of contentEncoding");
        result = MU_FAILURE;
    }
    else
    {
        if (handleData->contentEncoding != NULL)
        {
            free(handleData->contentEncoding);
        }
        handleData->contentEncoding = tmp_encoding;
        result = 0;
    }
    return result;
}